

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void store_maint(store *s)

{
  bitflag *pbVar1;
  byte bVar2;
  object_kind **ppoVar3;
  object *obj_00;
  _Bool _Var4;
  uint8_t uVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  object *poVar9;
  object_kind *poVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int A;
  int iVar14;
  int iVar15;
  wchar_t t;
  int iVar16;
  object *obj;
  object *local_60;
  wchar_t local_58;
  int local_54;
  object *local_50;
  store *local_48;
  object *local_40;
  int local_34;
  
  if (s->sidx != store_home_idx) {
    if (s->sidx == store_black_market_idx) {
      poVar9 = s->stock;
      while (obj_00 = poVar9, obj_00 != (object *)0x0) {
        poVar9 = obj_00->next;
        _Var4 = black_market_ok(s->town,obj_00);
        if (!_Var4) {
          if (obj_00->artifact != (artifact *)0x0) {
            history_lose_artifact(player,obj_00->artifact);
          }
          store_delete(s,obj_00,(uint)obj_00->number);
        }
      }
    }
    if (s->turnover == L'\0') {
      if ((s->always_num != 0) && (s->stock_num != 0)) {
        uVar6 = Rand_div((uint)s->stock_num);
        for (iVar14 = uVar6 + 1; iVar14 != 0; iVar14 = iVar14 + -1) {
          store_delete_random(s);
        }
      }
    }
    else {
      bVar2 = s->stock_num;
      uVar6 = Rand_div(s->turnover);
      wVar7 = ~uVar6 + (uint)bVar2;
      wVar8 = L'\0';
      if (L'\0' < wVar7) {
        wVar8 = wVar7;
      }
      if (s->normal_stock_max <= wVar8) {
        wVar8 = s->normal_stock_max;
      }
      if (wVar8 < (int)(uint)s->stock_num) {
        iVar14 = -100000;
        do {
          iVar14 = iVar14 + 1;
          if (iVar14 == 0) {
            quit_fmt("Unable to (de-)stock store %d. Please report this bug",(ulong)(s->sidx + 1));
            break;
          }
          store_delete_random(s);
        } while (wVar8 < (int)(uint)s->stock_num);
      }
    }
    if ((s->always_num != 0) && (s->always_num != 0)) {
      uVar12 = 0;
      do {
        poVar10 = s->always_table[uVar12];
        if (poVar10 == (object_kind *)0x0) {
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                        ,0x4d3,
                        "struct object *store_find_kind(struct store *, struct object_kind *, _Bool (*)(struct store *, struct object *))"
                       );
        }
        for (poVar9 = s->stock; poVar9 != (object *)0x0; poVar9 = poVar9->next) {
          if ((poVar9->kind == poVar10) &&
             (_Var4 = store_sale_should_reduce_stock(s,poVar9), !_Var4)) goto LAB_001cfea8;
        }
        poVar9 = (object *)0x0;
LAB_001cfea8:
        if (poVar9 == (object *)0x0) {
          local_60 = object_new();
          local_50 = object_new();
          object_prep(local_60,poVar10,L'\0',RANDOMISE);
          if (local_60->artifact != (artifact *)0x0) {
            __assert_fail("!obj->artifact",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                          ,0x5d2,
                          "struct object *store_create_item(struct store *, struct object_kind *)");
          }
          local_60->known = local_50;
          local_50->notice = local_50->notice | 2;
          object_set_base_known(player,local_60);
          pbVar1 = &local_60->known->notice;
          *pbVar1 = *pbVar1 | 2;
          player_know_object(player,local_60);
          local_60->origin = '\0';
          poVar9 = store_carry(s,local_60);
          if (poVar9 != (object *)0x0) goto LAB_001cff35;
          object_delete((chunk *)0x0,(chunk *)0x0,&local_50);
          local_60->known = (object *)0x0;
          object_delete((chunk *)0x0,(chunk *)0x0,&local_60);
        }
        else {
LAB_001cff35:
          uVar5 = (uint8_t)poVar9->kind->base->max_stack;
          poVar9->number = uVar5;
          poVar9->known->number = uVar5;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < s->always_num);
    }
    if (s->turnover != L'\0') {
      bVar2 = s->stock_num;
      uVar6 = Rand_div(s->turnover);
      iVar14 = uVar6 + bVar2 + 1;
      local_54 = (int)s->always_num;
      iVar11 = s->normal_stock_min + local_54;
      local_54 = local_54 + s->normal_stock_max;
      if (iVar14 < local_54) {
        local_54 = iVar14;
      }
      if (local_54 <= iVar11) {
        local_54 = iVar11;
      }
      if ((int)(uint)s->stock_num < local_54) {
        iVar14 = 100000;
        local_48 = s;
        iVar11 = local_54;
        do {
          if (iVar14 + -1 == 0) {
            quit_fmt("Unable to (re-)stock store %d. Please report this bug",
                     (ulong)(local_48->sidx + 1));
            return;
          }
          if (local_48->sidx == store_black_market_idx) {
            A = player->max_depth + 5;
            iVar13 = player->max_depth + 0x14;
          }
          else {
            iVar13 = player->max_depth + -0x14;
            if (player->max_depth < 0x14) {
              iVar13 = 0;
            }
            iVar13 = iVar13 + (uint)z_info->store_magic_level;
            A = 1;
          }
          if (0x36 < A) {
            A = 0x37;
          }
          if (0x45 < iVar13) {
            iVar13 = 0x46;
          }
          iVar15 = 0;
          local_34 = iVar14 + -1;
          do {
            wVar8 = rand_range(A,iVar13);
            if (local_48->sidx == store_black_market_idx) {
              poVar10 = get_obj_num(wVar8,false,L'\0');
            }
            else {
              ppoVar3 = local_48->normal_table;
              uVar6 = Rand_div((uint32_t)local_48->normal_num);
              poVar10 = ppoVar3[(int)uVar6];
            }
            if (poVar10->tval != L'\x01') {
              local_60 = object_new();
              object_prep(local_60,poVar10,wVar8,RANDOMISE);
              apply_magic(local_60,wVar8,false,false,false,false);
              if (local_60->artifact != (artifact *)0x0) {
                __assert_fail("!obj->artifact",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                              ,0x58b,"_Bool store_create_random(struct store *)");
              }
              _Var4 = tval_is_weapon(local_60);
              if ((((!_Var4) || ((-1 < local_60->to_h && (-1 < local_60->to_d)))) &&
                  ((_Var4 = tval_is_armor(local_60), !_Var4 || (-1 < local_60->to_a)))) &&
                 (local_60->curses == (curse_data *)0x0)) {
                local_50 = object_new();
                local_60->known = local_50;
                local_50->notice = local_50->notice | 2;
                object_set_base_known(player,local_60);
                pbVar1 = &local_60->known->notice;
                *pbVar1 = *pbVar1 | 2;
                player_know_object(player,local_60);
                local_60->origin = '\0';
                if (((local_48->sidx != store_black_market_idx) ||
                    (_Var4 = black_market_ok(local_48->town,local_60), _Var4)) &&
                   (wVar8 = object_value_real(local_60,L'\x01'), poVar9 = local_60, L'\0' < wVar8))
                {
                  wVar7 = L'\x01';
                  wVar8 = object_value_real(local_60,L'\x01');
                  switch(poVar9->tval) {
                  case '\x02':
                  case '\x03':
                  case '\x04':
                    if (wVar8 < L'\x06') {
                      uVar6 = Rand_div(2);
                      wVar7 = uVar6 * 0x14 + L'\x14';
                    }
                    else if (wVar8 < L'3') {
                      uVar6 = Rand_div(4);
                      wVar7 = uVar6 * 10 + L'\n';
                    }
                    else if (wVar8 < L'ǵ') {
                      uVar6 = Rand_div(4);
                      wVar7 = uVar6 * 5 + L'\x05';
                    }
                    break;
                  case '\x05':
                  case '\x06':
                  case '\a':
                  case '\b':
                  case '\t':
                  case '\n':
                  case '\v':
                  case '\f':
                  case '\r':
                  case '\x0e':
                  case '\x0f':
                  case '\x10':
                  case '\x11':
                    if (poVar9->ego == (ego_item *)0x0) {
                      wVar7 = L'\x01';
                      if (wVar8 < L'\v') {
                        iVar11 = 0;
                        iVar14 = 3;
                        local_58 = wVar8;
                        do {
                          uVar6 = Rand_div(5);
                          iVar11 = iVar11 + uVar6;
                          iVar14 = iVar14 + -1;
                        } while (iVar14 != 0);
                        wVar7 = iVar11 + L'\x01';
                        wVar8 = local_58;
                        iVar11 = local_54;
                      }
                      if (wVar8 < L'e') {
                        local_40 = poVar9;
                        iVar11 = 0;
                        iVar14 = 3;
                        do {
                          uVar6 = Rand_div(5);
                          iVar11 = iVar11 + uVar6;
                          iVar14 = iVar14 + -1;
                        } while (iVar14 != 0);
                        goto LAB_001d0310;
                      }
                    }
                    break;
                  case '\x13':
                  case '\x1b':
                  case '\x1c':
                  case '\x1d':
                    wVar7 = L'\x01';
                    local_40 = poVar9;
                    if (wVar8 < L'\x06') {
                      iVar16 = 0;
                      iVar14 = 3;
                      local_58 = wVar8;
                      do {
                        uVar6 = Rand_div(5);
                        iVar16 = iVar16 + uVar6;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
                      wVar7 = iVar16 + L'\x01';
                      wVar8 = local_58;
                    }
                    poVar9 = local_40;
                    if (wVar8 < L'\x15') {
                      iVar11 = 0;
                      iVar14 = 3;
                      do {
                        uVar6 = Rand_div(5);
                        iVar11 = iVar11 + uVar6;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
LAB_001d0310:
                      wVar7 = wVar7 + iVar11;
                      poVar9 = local_40;
                      iVar11 = local_54;
                    }
                    break;
                  case '\x19':
                  case '\x1a':
                    wVar7 = L'\x01';
                    if (wVar8 < L'=') {
                      iVar11 = 0;
                      iVar14 = 3;
                      local_58 = wVar8;
                      do {
                        uVar6 = Rand_div(5);
                        iVar11 = iVar11 + uVar6;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
                      wVar7 = iVar11 + L'\x01';
                      wVar8 = local_58;
                      iVar11 = local_54;
                    }
                    if (wVar8 < L'ñ') {
                      uVar6 = 5;
LAB_001d037d:
                      uVar6 = Rand_div(uVar6);
                      wVar7 = wVar7 + uVar6;
                    }
                    break;
                  case '\x1e':
                  case '\x1f':
                  case ' ':
                  case '!':
                  case '\"':
                    wVar7 = L'\x01';
                    if (wVar8 < L'3') {
                      iVar11 = 0;
                      iVar14 = 2;
                      local_58 = wVar8;
                      do {
                        uVar6 = Rand_div(3);
                        iVar11 = iVar11 + uVar6;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
                      wVar7 = iVar11 + L'\x01';
                      wVar8 = local_58;
                      iVar11 = local_54;
                    }
                    if (wVar8 < L'ǵ') {
                      uVar6 = 3;
                      goto LAB_001d037d;
                    }
                  }
                  wVar8 = poVar9->kind->base->max_stack;
                  uVar5 = (uint8_t)wVar8;
                  if (wVar7 < wVar8) {
                    uVar5 = (uint8_t)wVar7;
                  }
                  poVar9->number = uVar5;
                  poVar9 = store_carry(local_48,local_60);
                  if (poVar9 != (object *)0x0) break;
                }
                object_delete((chunk *)0x0,(chunk *)0x0,&local_50);
                local_60->known = (object *)0x0;
              }
              object_delete((chunk *)0x0,(chunk *)0x0,&local_60);
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 != 6);
          iVar14 = local_34;
        } while ((int)(uint)local_48->stock_num < iVar11);
      }
    }
  }
  return;
}

Assistant:

static void store_maint(struct store *s)
{
	/* Ignore home */
	if (store_is_home(s))
		return;

	/* Destroy crappy black market items */
	if (store_is_black_market(s)) {
		struct object *obj = s->stock;
		while (obj) {
			struct object *next = obj->next;
			if (!black_market_ok(s->town, obj)) {
				if (obj->artifact) {
					history_lose_artifact(player,
										  obj->artifact);
				}
				store_delete(s, obj, obj->number);
			}
			obj = next;
		}
	}

	/* We want to make sure stores have staple items. If there's
	 * turnover, we also want to delete a few items, and add a few
	 * items.
	 *
	 * If we create staple items, then delete items, then create new
	 * items, we are stuck with one of three choices:
	 * 1. We can risk deleting staple items, and not having any left.
	 * 2. We can refuse to delete staple items, and risk having that
	 * become an infinite loop.
	 * 3. We can do a ton of extra bookkeeping to make sure we delete
	 * staple items only if there's duplicates of them.
	 *
	 * What if we change the order? First sell a handful of random items,
	 * then create any missing staples, then create new items. This
	 * has two tests for s->turnover, but simplifies everything else
	 * dramatically.
	 */

	if (s->turnover) {
		int restock_attempts = 100000;
		int stock = s->stock_num - randint1(s->turnover);

		/* We'll end up adding staples for sure, maybe plus other
		 * items. It's fine if we sell out completely, though, if
		 * turnover is high. The cap doesn't include always_num,
		 * because otherwise the addition of missing staples could
		 * put us over (if the store was full of player-sold loot).
		 */
		int min = 0;
		int max = s->normal_stock_max;

		if (stock < min) stock = min;
		if (stock > max) stock = max;

		/* Destroy random objects until only "stock" slots are left */
		while (s->stock_num > stock && --restock_attempts)
			store_delete_random(s);

		if (!restock_attempts)
			quit_fmt("Unable to (de-)stock store %d. Please report this bug",
					 s->sidx + 1);
	} else {
		/* For the Bookseller, occasionally sell a book */
		if (s->always_num && s->stock_num) {
			int sales = randint1(s->stock_num);
			while (sales--) {
				store_delete_random(s);
			}
		}
	}

	/* Ensure staples are created */
	if (s->always_num) {
		size_t i;
		for (i = 0; i < s->always_num; i++) {
			struct object_kind *kind = s->always_table[i];
			struct object *obj = store_find_kind(s, kind,
				store_sale_should_reduce_stock);

			/* Create the item if it doesn't exist */
			if (!obj) {
				obj = store_create_item(s, kind);
				if (!obj) continue;
			}

			/* Ensure a full stack */
			obj->number = obj->kind->base->max_stack;
			obj->known->number = obj->kind->base->max_stack;
		}
	}

	if (s->turnover) {
		int restock_attempts = 100000;
		int stock = s->stock_num + randint1(s->turnover);

		/* Now that the staples exist, we want to add more
		 * items, at least enough to get us to normal_stock_min
		 * items that aren't necessarily staples.
		 */

		int min = s->normal_stock_min + s->always_num;
		int max = s->normal_stock_max + s->always_num;

		/* Buy a few items */

		/* Keep stock between specified min and max slots */
		if (stock > max) stock = max;
		if (stock < min) stock = min;

		/* For the rest, we just choose items randomlyish */
		/* The (huge) restock_attempts will only go to zero (otherwise
		 * infinite loop) if stores don't have enough items they can stock! */
		while (s->stock_num < stock && --restock_attempts)
			store_create_random(s);

		if (!restock_attempts)
			quit_fmt("Unable to (re-)stock store %d. Please report this bug",
					 s->sidx + 1);
	}
}